

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_MultipleInputsWithImport_DescriptorSetIn_Test::TestBody
          (CommandLineInterfaceTest_MultipleInputsWithImport_DescriptorSetIn_Test *this)

{
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar3;
  Arena *pAVar4;
  AlphaNum *in_R8;
  AlphaNum *c;
  string_view filename;
  string_view filename_00;
  string_view format;
  string_view format_00;
  allocator<char> local_193;
  allocator<char> local_192;
  allocator<char> local_191;
  AlphaNum local_190;
  AlphaNum local_160;
  string local_130;
  string local_100;
  string local_d0;
  string local_b0;
  string local_90;
  FileDescriptorSet file_descriptor_set;
  
  FileDescriptorSet::FileDescriptorSet(&file_descriptor_set);
  this_00 = &file_descriptor_set.field_0._impl_.file_;
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pAVar4 = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar1->field_0)._impl_.name_,"foo.proto",pAVar4);
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar1->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar4 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,"Foo",pAVar4);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pAVar4 = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar1->field_0)._impl_.name_,"bar.proto",pAVar4);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[10]>
            (&(pVVar1->field_0)._impl_.dependency_,(char (*) [10])0xe81c18);
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar1->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar4 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,"Bar",pAVar4);
  pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&(pVVar2->field_0)._impl_.field_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 4;
  pAVar4 = (Arena *)(pVVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar3->field_0)._impl_.type_name_,"Baz",pAVar4);
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 1;
  pAVar4 = (Arena *)(pVVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar3->field_0)._impl_.name_,"a",pAVar4);
  (pVVar3->field_0)._impl_.number_ = 1;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 0x40;
  filename._M_str = "foo_and_bar.bin";
  filename._M_len = 0xf;
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,filename,&file_descriptor_set);
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
            (&this_00->super_RepeatedPtrFieldBase);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pAVar4 = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar1->field_0)._impl_.name_,"baz.proto",pAVar4);
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar1->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar4 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,"Baz",pAVar4);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pAVar4 = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar1->field_0)._impl_.name_,"bat.proto",pAVar4);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[10]>
            (&(pVVar1->field_0)._impl_.dependency_,(char (*) [10])0xe81c18);
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar1->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar4 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,"Bat",pAVar4);
  pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&(pVVar2->field_0)._impl_.field_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 4;
  pAVar4 = (Arena *)(pVVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar3->field_0)._impl_.type_name_,"Baz",pAVar4);
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 1;
  pAVar4 = (Arena *)(pVVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar3->field_0)._impl_.name_,"a",pAVar4);
  (pVVar3->field_0)._impl_.number_ = 1;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 0x40;
  filename_00._M_str = "baz_and_bat.bin";
  filename_00._M_len = 0xf;
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,filename_00,&file_descriptor_set);
  local_130._0_16_ = absl::lts_20250127::NullSafeStringView("$tmpdir/foo_and_bar.bin");
  local_160.piece_ = absl::lts_20250127::NullSafeStringView(":");
  local_190.piece_ = absl::lts_20250127::NullSafeStringView("$tmpdir/baz_and_bat.bin");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d0,(lts_20250127 *)&local_130,&local_160,&local_190,in_R8);
  local_100._M_dataplus._M_p = (pointer)local_d0._M_string_length;
  local_100._M_string_length = (size_type)local_d0._M_dataplus._M_p;
  format._M_str = (char *)&local_100;
  format._M_len =
       (size_t)
       "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir --descriptor_set_in=$0 foo.proto bar.proto"
  ;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_90,(lts_20250127 *)&DAT_00000064,format,(Arg *)in_R8);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_generator",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"foo.proto,bar.proto",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"foo.proto",&local_192);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Foo",&local_193);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_130,(string *)&local_160,
             (string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_generator",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"foo.proto,bar.proto",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"bar.proto",&local_192);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Bar",&local_193);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_130,(string *)&local_160,
             (string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_plugin",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"foo.proto,bar.proto",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"foo.proto",&local_192);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Foo",&local_193);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_130,(string *)&local_160,
             (string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_plugin",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"foo.proto,bar.proto",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"bar.proto",&local_192);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Bar",&local_193);
  c = &local_190;
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_130,(string *)&local_160,
             (string *)c);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_100);
  local_130._0_16_ = absl::lts_20250127::NullSafeStringView("$tmpdir/foo_and_bar.bin");
  local_160.piece_ = absl::lts_20250127::NullSafeStringView(":");
  local_190.piece_ = absl::lts_20250127::NullSafeStringView("$tmpdir/baz_and_bat.bin");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_d0,(lts_20250127 *)&local_130,&local_160,&local_190,c);
  local_100._M_dataplus._M_p = (pointer)local_d0._M_string_length;
  local_100._M_string_length = (size_type)local_d0._M_dataplus._M_p;
  format_00._M_str = (char *)&local_100;
  format_00._M_len =
       (size_t)
       "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir --descriptor_set_in=$0 baz.proto bat.proto"
  ;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_b0,(lts_20250127 *)&DAT_00000064,format_00,(Arg *)c);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_generator",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"baz.proto,bat.proto",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"baz.proto",&local_192);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Baz",&local_193);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_130,(string *)&local_160,
             (string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_generator",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"baz.proto,bat.proto",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"bat.proto",&local_192);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Bat",&local_193);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_130,(string *)&local_160,
             (string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_plugin",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"baz.proto,bat.proto",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"baz.proto",&local_192);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Baz",&local_193);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_130,(string *)&local_160,
             (string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_plugin",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"baz.proto,bat.proto",&local_191);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"bat.proto",&local_192);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"Bat",&local_193);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_130,(string *)&local_160,
             (string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_100);
  FileDescriptorSet::~FileDescriptorSet(&file_descriptor_set);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, MultipleInputsWithImport_DescriptorSetIn) {
  // Test parsing multiple input files with an import of a separate file.
  FileDescriptorSet file_descriptor_set;

  FileDescriptorProto* file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("foo.proto");
  file_descriptor_proto->add_message_type()->set_name("Foo");

  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("bar.proto");
  file_descriptor_proto->add_dependency("baz.proto");
  DescriptorProto* message = file_descriptor_proto->add_message_type();
  message->set_name("Bar");
  FieldDescriptorProto* field = message->add_field();
  field->set_type_name("Baz");
  field->set_name("a");
  field->set_number(1);

  WriteDescriptorSet("foo_and_bar.bin", &file_descriptor_set);

  file_descriptor_set.clear_file();
  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("baz.proto");
  file_descriptor_proto->add_message_type()->set_name("Baz");

  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("bat.proto");
  file_descriptor_proto->add_dependency("baz.proto");
  message = file_descriptor_proto->add_message_type();
  message->set_name("Bat");
  field = message->add_field();
  field->set_type_name("Baz");
  field->set_name("a");
  field->set_number(1);

  WriteDescriptorSet("baz_and_bat.bin", &file_descriptor_set);
  Run(absl::Substitute(
      "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir "
      "--descriptor_set_in=$0 foo.proto bar.proto",
      absl::StrCat("$tmpdir/foo_and_bar.bin",
                   CommandLineInterface::kPathSeparator,
                   "$tmpdir/baz_and_bat.bin")));

  ExpectNoErrors();
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");

  Run(absl::Substitute(
      "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir "
      "--descriptor_set_in=$0 baz.proto bat.proto",
      absl::StrCat("$tmpdir/foo_and_bar.bin",
                   CommandLineInterface::kPathSeparator,
                   "$tmpdir/baz_and_bat.bin")));

  ExpectNoErrors();
  ExpectGeneratedWithMultipleInputs("test_generator", "baz.proto,bat.proto",
                                    "baz.proto", "Baz");
  ExpectGeneratedWithMultipleInputs("test_generator", "baz.proto,bat.proto",
                                    "bat.proto", "Bat");
  ExpectGeneratedWithMultipleInputs("test_plugin", "baz.proto,bat.proto",
                                    "baz.proto", "Baz");
  ExpectGeneratedWithMultipleInputs("test_plugin", "baz.proto,bat.proto",
                                    "bat.proto", "Bat");
}